

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestTimeConstraint.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_31bae::TestTimeConstraintFailureIncludesCorrectData::
TestTimeConstraintFailureIncludesCorrectData(TestTimeConstraintFailureIncludesCorrectData *this)

{
  char *suiteName;
  TestTimeConstraintFailureIncludesCorrectData *this_local;
  
  suiteName = UnitTestSuite::GetSuiteName();
  UnitTest::Test::Test
            (&this->super_Test,"TimeConstraintFailureIncludesCorrectData",suiteName,
             "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/UnitTest++/src/tests/TestTimeConstraint.cpp"
             ,0x22);
  (this->super_Test)._vptr_Test =
       (_func_int **)&PTR__TestTimeConstraintFailureIncludesCorrectData_001854d8;
  return;
}

Assistant:

TEST(TimeConstraintFailureIncludesCorrectData)
{
    RecordingReporter reporter;
    TestResults result(&reporter);
    {
		ScopedCurrentTest scopedResult(result);

		TestDetails const details("testname", "suitename", "filename", 10);
        TimeConstraint t(10, details);
        TimeHelpers::SleepMs(20);
    }

	using namespace std;

	CHECK(strstr(reporter.lastFailedFile, "filename"));
    CHECK_EQUAL(10, reporter.lastFailedLine);
    CHECK(strstr(reporter.lastFailedTest, "testname"));
}